

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

void swrenderer::rt_flip_posts(void)

{
  undefined4 uVar1;
  undefined4 *puVar2;
  ulong uVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  
  uVar3 = (ulong)((drawerargs::dc_x & 3) << 3);
  puVar4 = *(undefined4 **)((long)&drawerargs::dc_ctspan + uVar3);
  for (puVar2 = *(undefined4 **)((long)&drawerargs::horizspan + uVar3); puVar5 = puVar4 + -2,
      puVar2 < puVar5; puVar2 = puVar2 + 2) {
    uVar1 = *puVar2;
    *puVar2 = *puVar5;
    *puVar5 = uVar1;
    uVar1 = puVar2[1];
    puVar2[1] = puVar4[-1];
    puVar4[-1] = uVar1;
    puVar4 = puVar5;
  }
  return;
}

Assistant:

void rt_flip_posts()
	{
		using namespace drawerargs;

		unsigned int *front = horizspan[dc_x & 3];
		unsigned int *back = dc_ctspan[dc_x & 3] - 2;

		while (front < back)
		{
			swapvalues(front[0], back[0]);
			swapvalues(front[1], back[1]);
			front += 2;
			back -= 2;
		}
	}